

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O3

int input_huffman(uchar *infile)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = bits_to_go;
  if (bits_to_go < 3) {
    buffer2 = buffer2 << 8 | (uint)infile[nextchar];
    nextchar = nextchar + 1;
    iVar3 = bits_to_go + 8;
  }
  bits_to_go = iVar3 + -3;
  uVar2 = buffer2 >> ((byte)bits_to_go & 0x1f) & 7;
  if (uVar2 < 4) {
    return 1 << (sbyte)uVar2;
  }
  if (bits_to_go == 0) {
    buffer2 = (int)infile[nextchar];
    nextchar = nextchar + 1;
    bits_to_go = 7;
  }
  else {
    bits_to_go = iVar3 - 4;
  }
  uVar2 = (uint)(((uint)buffer2 >> (bits_to_go & 0x1fU) & 1) != 0) + uVar2 * 2;
  if (uVar2 < 0xd) {
    return (&UINT_001d84a4)[uVar2];
  }
  if (bits_to_go != 0) {
    bits_to_go = bits_to_go - 1;
    iVar3 = (*(code *)(&DAT_001d8364 +
                      *(int *)(&DAT_001d8364 +
                              (ulong)(((uint)(((uint)buffer2 >> (bits_to_go & 0x1fU) & 1) != 0) +
                                      uVar2 * 2) - 0x1a) * 4)))();
    return iVar3;
  }
  pbVar1 = infile + nextchar;
  buffer2 = (int)*pbVar1;
  nextchar = nextchar + 1;
  bits_to_go = 7;
  iVar3 = (*(code *)(&DAT_001d8364 +
                    *(int *)(&DAT_001d8364 +
                            (ulong)(((uint)((char)*pbVar1 < '\0') + uVar2 * 2) - 0x1a) * 4)))();
  return iVar3;
}

Assistant:

static int input_nbits(unsigned char *infile, int n)
{
    /* AND mask for retreiving the right-most n bits */
    static int mask[9] = {0, 1, 3, 7, 15, 31, 63, 127, 255};

	if (bits_to_go < n) {
		/*
		 * need another byte's worth of bits
		 */

		buffer2 = (buffer2<<8) | (int) infile[nextchar];
		nextchar++;
		bits_to_go += 8;
	}
	/*
	 * now pick off the first n bits
	 */
	bits_to_go -= n;

        /* there was a slight gain in speed by replacing the following line */
/*	return( (buffer2>>bits_to_go) & ((1<<n)-1) ); */
	return( (buffer2>>bits_to_go) & (*(mask+n)) ); 
}